

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

void __thiscall
burst::
difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
::drop_subtrahend_head
          (difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
           *this)

{
  bool bVar1;
  reference piVar2;
  reference __u;
  _Fwd_list_const_iterator<int> _Var3;
  undefined1 local_20 [8];
  iterator_range<std::_Fwd_list_const_iterator<int>_> subtrahend;
  difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
  *this_local;
  
  subtrahend.
  super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_node = (_Fwd_list_node_base *)this;
  bVar1 = std::operator!=(&this->m_minuend_begin,&this->m_minuend_end);
  if ((bVar1) && (bVar1 = std::operator!=(&this->m_subtrahend_begin,&this->m_subtrahend_end), bVar1)
     ) {
    piVar2 = std::_Fwd_list_const_iterator<int>::operator*(&this->m_subtrahend_begin);
    __u = std::_Fwd_list_const_iterator<int>::operator*(&this->m_minuend_begin);
    bVar1 = (((std::forward<int_const&>)({parm#1}))<((std::forward<int_const&>)({parm#2})))std::
            less<void>::operator()(&this->field_0x20,piVar2,__u);
    if (bVar1) {
      _local_20 = (iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   )boost::make_iterator_range<std::_Fwd_list_const_iterator<int>>
                              ((this->m_subtrahend_begin)._M_node,(this->m_subtrahend_end)._M_node);
      piVar2 = std::_Fwd_list_const_iterator<int>::operator*(&this->m_minuend_begin);
      skip_to_lower_bound<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,int,std::less<void>>
                (local_20,piVar2);
      _Var3 = boost::iterator_range_detail::
              iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              ::begin((iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                       *)local_20);
      (this->m_subtrahend_begin)._M_node = _Var3._M_node;
    }
  }
  return;
}

Assistant:

void drop_subtrahend_head ()
        {
            if (m_minuend_begin != m_minuend_end
                && m_subtrahend_begin != m_subtrahend_end
                && m_compare(*m_subtrahend_begin, *m_minuend_begin))
            {
                auto subtrahend = boost::make_iterator_range(m_subtrahend_begin, m_subtrahend_end);
                skip_to_lower_bound(subtrahend, *m_minuend_begin, m_compare);
                m_subtrahend_begin = subtrahend.begin();
            }
        }